

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O2

void uu_encode(archive_string *as,uchar *p,size_t len)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  
  cVar2 = (char)len + ' ';
  if ((int)len == 0) {
    cVar2 = '`';
  }
  archive_strappend_char(as,cVar2);
  pbVar3 = p + 2;
  for (; 2 < len; len = len - 3) {
    cVar2 = (pbVar3[-2] >> 2) + 0x20;
    if (pbVar3[-2] < 4) {
      cVar2 = '`';
    }
    archive_strappend_char(as,cVar2);
    bVar1 = (pbVar3[-2] & 3) << 4 | pbVar3[-1] >> 4;
    cVar2 = bVar1 + 0x20;
    if (bVar1 == 0) {
      cVar2 = '`';
    }
    archive_strappend_char(as,cVar2);
    bVar1 = (pbVar3[-1] & 0xf) << 2 | *pbVar3 >> 6;
    cVar2 = bVar1 + 0x20;
    if (bVar1 == 0) {
      cVar2 = '`';
    }
    archive_strappend_char(as,cVar2);
    cVar2 = (*pbVar3 & 0x3f) + 0x20;
    if ((*pbVar3 & 0x3f) == 0) {
      cVar2 = '`';
    }
    archive_strappend_char(as,cVar2);
    pbVar3 = pbVar3 + 3;
  }
  if (len != 0) {
    cVar2 = (pbVar3[-2] >> 2) + 0x20;
    if (pbVar3[-2] < 4) {
      cVar2 = '`';
    }
    archive_strappend_char(as,cVar2);
    bVar1 = (pbVar3[-2] & 3) * '\x10';
    if (len == 1) {
      cVar2 = bVar1 + 0x20;
      if ((pbVar3[-2] & 3) == 0) {
        cVar2 = '`';
      }
      archive_strappend_char(as,cVar2);
      cVar2 = '`';
    }
    else {
      bVar1 = pbVar3[-1] >> 4 | bVar1;
      cVar2 = bVar1 + 0x20;
      if (bVar1 == 0) {
        cVar2 = '`';
      }
      archive_strappend_char(as,cVar2);
      cVar2 = (pbVar3[-1] & 0xf) * '\x04' + ' ';
      if ((pbVar3[-1] & 0xf) == 0) {
        cVar2 = '`';
      }
    }
    archive_strappend_char(as,cVar2);
    archive_strappend_char(as,'`');
  }
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
uu_encode(struct archive_string *as, const unsigned char *p, size_t len)
{
	int c;

	c = (int)len;
	archive_strappend_char(as, c?c + 0x20:'`');
	for (; len >= 3; p += 3, len -= 3) {
		c = p[0] >> 2;
		archive_strappend_char(as, c?c + 0x20:'`');
		c = ((p[0] & 0x03) << 4) | ((p[1] & 0xf0) >> 4);
		archive_strappend_char(as, c?c + 0x20:'`');
		c = ((p[1] & 0x0f) << 2) | ((p[2] & 0xc0) >> 6);
		archive_strappend_char(as, c?c + 0x20:'`');
		c = p[2] & 0x3f;
		archive_strappend_char(as, c?c + 0x20:'`');
	}
	if (len > 0) {
		c = p[0] >> 2;
		archive_strappend_char(as, c?c + 0x20:'`');
		c = (p[0] & 0x03) << 4;
		if (len == 1) {
			archive_strappend_char(as, c?c + 0x20:'`');
			archive_strappend_char(as, '`');
			archive_strappend_char(as, '`');
		} else {
			c |= (p[1] & 0xf0) >> 4;
			archive_strappend_char(as, c?c + 0x20:'`');
			c = (p[1] & 0x0f) << 2;
			archive_strappend_char(as, c?c + 0x20:'`');
			archive_strappend_char(as, '`');
		}
	}
	archive_strappend_char(as, '\n');
}